

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O1

bool __thiscall
prometheus::Registry::Remove<prometheus::Counter>
          (Registry *this,Family<prometheus::Counter> *family)

{
  mutex *__mutex;
  unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>
  *puVar1;
  int iVar2;
  __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>_>
  __position;
  undefined8 uVar3;
  
  __mutex = &this->mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>>>>,__gnu_cxx::__ops::_Iter_pred<prometheus::Registry::Remove<prometheus::Counter>(prometheus::Family<prometheus::Counter>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Counter>,std::default_delete<prometheus::Family<prometheus::Counter>>>const&)_1_>>
                           ((this->counters_).
                            super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->counters_).
                            super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,family);
    puVar1 = (this->counters_).
             super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current != puVar1) {
      std::
      vector<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Counter>,_std::default_delete<prometheus::Family<prometheus::Counter>_>_>_>_>
      ::_M_erase(&this->counters_,(iterator)__position._M_current);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __position._M_current != puVar1;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

bool Registry::Remove(const Family<T>& family) {
  std::lock_guard<std::mutex> lock{mutex_};

  auto& families = GetFamilies<T>();
  auto same_family = [&family](const std::unique_ptr<Family<T>>& in) {
    return &family == in.get();
  };

  auto it = std::find_if(families.begin(), families.end(), same_family);
  if (it == families.end()) {
    return false;
  }

  families.erase(it);
  return true;
}